

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

void rhash_sha3_final(sha3_ctx *ctx,uchar *result)

{
  ulong __n;
  ulong block_size_00;
  size_t block_size;
  size_t digest_length;
  uchar *result_local;
  sha3_ctx *ctx_local;
  
  __n = (ulong)(100 - (ctx->block_size >> 1));
  block_size_00 = (ulong)ctx->block_size;
  if ((ctx->rest & 0x80000000) == 0) {
    memset((void *)((long)ctx->message + (ulong)ctx->rest),0,block_size_00 - ctx->rest);
    *(byte *)((long)ctx->message + (ulong)ctx->rest) =
         *(byte *)((long)ctx->message + (ulong)ctx->rest) | 6;
    *(byte *)((long)ctx->message + (block_size_00 - 1)) =
         *(byte *)((long)ctx->message + (block_size_00 - 1)) | 0x80;
    rhash_sha3_process_block(ctx->hash,ctx->message,block_size_00);
    ctx->rest = 0x80000000;
  }
  if (__n < block_size_00) {
    if (result != (uchar *)0x0) {
      memcpy(result,ctx,__n);
    }
    return;
  }
  __assert_fail("block_size > digest_length",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibrhash/librhash/sha3.c"
                ,0x14b,"void rhash_sha3_final(sha3_ctx *, unsigned char *)");
}

Assistant:

void rhash_sha3_final(sha3_ctx* ctx, unsigned char* result)
{
	size_t digest_length = 100 - ctx->block_size / 2;
	const size_t block_size = ctx->block_size;

	if (!(ctx->rest & SHA3_FINALIZED))
	{
		/* clear the rest of the data queue */
		memset((char*)ctx->message + ctx->rest, 0, block_size - ctx->rest);
		((char*)ctx->message)[ctx->rest] |= 0x06;
		((char*)ctx->message)[block_size - 1] |= 0x80;

		/* process final block */
		rhash_sha3_process_block(ctx->hash, ctx->message, block_size);
		ctx->rest = SHA3_FINALIZED; /* mark context as finalized */
	}

	assert(block_size > digest_length);
	if (result) me64_to_le_str(result, ctx->hash, digest_length);
}